

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall TPZAnalysis::CleanUp(TPZAnalysis *this)

{
  TPZSolutionMatrix *in_RDI;
  int *piVar1;
  long *plVar2;
  TPZAutoPointer<TPZStructMatrix> *unaff_retaddr;
  int dim;
  long *in_stack_ffffffffffffffd8;
  double *in_stack_ffffffffffffffe0;
  int local_c;
  TPZSolutionMatrix *rval;
  
  rval = in_RDI;
  if (in_RDI[1].fRealMatrix.fGiven != (double *)0x0) {
    in_stack_ffffffffffffffe0 = in_RDI[1].fRealMatrix.fGiven;
    if (in_stack_ffffffffffffffe0 != (double *)0x0) {
      (**(code **)((long)*in_stack_ffffffffffffffe0 + 8))();
    }
    in_RDI[1].fRealMatrix.fGiven = (double *)0x0;
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    if ((*(long *)((in_RDI->fRealMatrix).fPivot.fExtAlloc + (long)local_c * 2 + -0x12) != 0) &&
       (in_stack_ffffffffffffffd8 =
             *(long **)((in_RDI->fRealMatrix).fPivot.fExtAlloc + (long)local_c * 2 + -0x12),
       in_stack_ffffffffffffffd8 != (long *)0x0)) {
      (**(code **)(*in_stack_ffffffffffffffd8 + 8))();
    }
    piVar1 = (in_RDI->fRealMatrix).fPivot.fExtAlloc + (long)local_c * 2 + -0x12;
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1 = in_RDI[1].fRealMatrix.fPivot.fExtAlloc + (long)local_c * 8 + -10;
    (**(code **)(*(long *)piVar1 + 0x20))(piVar1,0);
    plVar2 = (long *)((long)(&((TPZFMatrix<std::complex<double>_> *)
                              (&((TPZFMatrix<std::complex<double>_> *)
                                (&in_RDI[1].fComplexMatrix.fPivot + -1))->fPivot + -1))->fPivot +
                            0xffffffffffffffff) + (long)local_c * 0x20);
    (**(code **)(*plVar2 + 0x20))(plVar2,0);
  }
  (in_RDI->fRealMatrix).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  *(undefined8 *)&in_RDI->fSolType = 0;
  TPZSolutionMatrix::Redim
            (in_RDI,(int64_t)in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8);
  TPZAutoPointer<TPZStructMatrix>::operator=(unaff_retaddr,(TPZStructMatrix *)rval);
  TPZAutoPointer<TPZRenumbering>::operator=
            ((TPZAutoPointer<TPZRenumbering> *)unaff_retaddr,(TPZRenumbering *)rval);
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)unaff_retaddr,(TPZGuiInterface *)rval);
  return;
}

Assistant:

void TPZAnalysis::CleanUp()
{
    if(fSolver) {
        delete fSolver;
        fSolver = nullptr;
    }
    int dim;
    for(dim=0; dim<3; dim++) {
        if(fGraphMesh[dim]) delete fGraphMesh[dim];
        fGraphMesh[dim] = nullptr;
        fScalarNames[dim].resize(0);
        fVectorNames[dim].resize(0);
    }
    fCompMesh = nullptr;
    fGeoMesh = nullptr;
    fSolution.Redim(0,0);
    fStructMatrix = nullptr;
    fRenumber = nullptr;
    fGuiInterface = nullptr;
    
}